

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall Database::Database(Database *this,string *fname,bool initialize)

{
  _Rb_tree_header *p_Var1;
  path *ppVar2;
  pointer __p;
  path fpath;
  undefined1 auStack_f8 [72];
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pointer local_98;
  undefined1 uStack_90;
  undefined7 uStack_8f;
  undefined1 local_88;
  undefined7 uStack_87;
  _Type local_80;
  vector<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  local_78;
  path local_60;
  
  __p = (pointer)auStack_f8;
  (this->db_name)._M_pathname._M_dataplus._M_p = (pointer)&(this->db_name)._M_pathname.field_2;
  (this->db_name)._M_pathname._M_string_length = 0;
  (this->db_name)._M_pathname.field_2._M_local_buf[0] = '\0';
  (this->db_name)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->db_name)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->db_name)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->db_name)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->db_base)._M_pathname._M_dataplus._M_p = (pointer)&(this->db_base)._M_pathname.field_2;
  (this->db_base)._M_pathname._M_string_length = 0;
  (this->db_base)._M_pathname.field_2._M_local_buf[0] = '\0';
  (this->db_base)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->db_base)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->db_base)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->db_base)._M_cmpts.
           super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  p_Var1 = &(this->iterators)._M_t._M_impl.super__Rb_tree_header;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->iterators)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->working_datasets).super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->working_datasets).super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->working_datasets).super__Vector_base<OnDiskDataset_*,_std::allocator<OnDiskDataset_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->loaded_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->loaded_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->loaded_datasets).
  super__Vector_base<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>,_std::allocator<std::unique_ptr<OnDiskDataset,_std::default_delete<OnDiskDataset>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DatabaseConfig::DatabaseConfig(&this->config_);
  this->last_task_id = 0;
  (this->tasks)._M_h._M_buckets = &(this->tasks)._M_h._M_single_bucket;
  (this->tasks)._M_h._M_bucket_count = 1;
  (this->tasks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tasks)._M_h._M_element_count = 0;
  (this->tasks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tasks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tasks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            ((path *)(auStack_f8 + 0x40),fname);
  std::experimental::filesystem::v1::current_path_abi_cxx11_((v1 *)auStack_f8);
  std::experimental::filesystem::v1::absolute
            ((v1 *)&local_60,(path *)(auStack_f8 + 0x40),(path *)auStack_f8);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)auStack_f8);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)(auStack_f8 + 0x40));
  std::experimental::filesystem::v1::__cxx11::path::path((path *)auStack_f8,&local_60);
  if (auStack_f8._8_8_ == 0) {
    auStack_f8._64_8_ = &local_a8;
    local_b0 = 0;
    local_a8._M_local_buf[0] = '\0';
    local_98 = (pointer)0x0;
    uStack_90 = 0;
    uStack_8f = 0;
    local_88 = 0;
    uStack_87 = 0;
    local_80 = _Multi;
  }
  else {
    if (auStack_f8[0x38] != _Multi) {
      auStack_f8._40_8_ = (pointer)0x0;
    }
    if (auStack_f8[0x38] == _Multi) {
      __p = (pointer)(auStack_f8._40_8_ + -0x48);
    }
    std::experimental::filesystem::v1::__cxx11::path::path
              ((path *)(auStack_f8 + 0x40),&__p->super_path);
  }
  ppVar2 = (path *)(auStack_f8 + 0x40);
  std::__cxx11::string::operator=((string *)this,(string *)ppVar2);
  local_78.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->db_name)._M_cmpts.
       super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->db_name)._M_cmpts.
       super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->db_name)._M_cmpts.
       super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->db_name)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start = local_98;
  (this->db_name)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT71(uStack_8f,uStack_90);
  (this->db_name)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_87,local_88);
  local_98 = (pointer)0x0;
  uStack_90 = 0;
  uStack_8f = 0;
  local_88 = 0;
  uStack_87 = 0;
  std::
  vector<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ::~vector(&local_78);
  (this->db_name)._M_type = local_80;
  std::experimental::filesystem::v1::__cxx11::path::clear(ppVar2);
  std::experimental::filesystem::v1::__cxx11::path::~path(ppVar2);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)auStack_f8);
  std::experimental::filesystem::v1::__cxx11::path::path((path *)auStack_f8,&local_60);
  std::experimental::filesystem::v1::__cxx11::path::parent_path();
  ppVar2 = (path *)(auStack_f8 + 0x40);
  std::__cxx11::string::operator=((string *)&this->db_base,(string *)ppVar2);
  local_78.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->db_base)._M_cmpts.
       super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->db_base)._M_cmpts.
       super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->db_base)._M_cmpts.
       super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->db_base)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_start = local_98;
  (this->db_base)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT71(uStack_8f,uStack_90);
  (this->db_base)._M_cmpts.
  super__Vector_base<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_87,local_88);
  local_98 = (pointer)0x0;
  uStack_90 = 0;
  uStack_8f = 0;
  local_88 = 0;
  uStack_87 = 0;
  std::
  vector<std::experimental::filesystem::v1::__cxx11::path::_Cmpt,_std::allocator<std::experimental::filesystem::v1::__cxx11::path::_Cmpt>_>
  ::~vector(&local_78);
  (this->db_base)._M_type = local_80;
  std::experimental::filesystem::v1::__cxx11::path::clear(ppVar2);
  std::experimental::filesystem::v1::__cxx11::path::~path(ppVar2);
  std::experimental::filesystem::v1::__cxx11::path::~path((path *)auStack_f8);
  if (initialize) {
    load_from_disk(this);
  }
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_60);
  return;
}

Assistant:

Database::Database(const std::string &fname, bool initialize)
    : last_task_id(0) {
    fs::path fpath = fs::absolute(fname);
    db_name = fs::path(fpath).filename();
    db_base = fs::path(fpath).parent_path();

    if (initialize) {
        load_from_disk();
    }
}